

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Point>::Inserter::insertOne(Inserter *this,qsizetype pos,Point *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Point *pPVar3;
  qsizetype qVar4;
  Point *pPVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pPVar3 = this->begin;
  lVar11 = this->size;
  pPVar5 = pPVar3 + lVar11;
  this->end = pPVar5;
  this->last = pPVar3 + lVar11 + -1;
  this->where = pPVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (0 < lVar11) {
    pDVar7 = pPVar5[-1].name.d.d;
    pcVar8 = pPVar5[-1].name.d.ptr;
    pPVar5[-1].name.d.d = (Data *)0x0;
    pPVar5[-1].name.d.ptr = (char16_t *)0x0;
    (pPVar5->name).d.d = pDVar7;
    (pPVar5->name).d.ptr = pcVar8;
    qVar4 = pPVar5[-1].name.d.size;
    pPVar5[-1].name.d.size = 0;
    (pPVar5->name).d.size = qVar4;
    pDVar7 = pPVar5[-1].parameters.d.d;
    pcVar8 = pPVar5[-1].parameters.d.ptr;
    pPVar5[-1].parameters.d.d = (Data *)0x0;
    pPVar5[-1].parameters.d.ptr = (char16_t *)0x0;
    (pPVar5->parameters).d.d = pDVar7;
    (pPVar5->parameters).d.ptr = pcVar8;
    qVar4 = pPVar5[-1].parameters.d.size;
    pPVar5[-1].parameters.d.size = 0;
    (pPVar5->parameters).d.size = qVar4;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pPVar5 = this->last;
        puVar2 = (undefined8 *)((long)&(pPVar5->name).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pPVar5[-1].name.d.d + lVar11);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar5->name).d.d + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)&pPVar5[-1].name.d.d + lVar11);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pPVar5->name).d.size + lVar11);
        *(undefined8 *)((long)&(pPVar5->name).d.size + lVar11) =
             *(undefined8 *)((long)pPVar5 + lVar11 + -0x20);
        *(undefined8 *)((long)pPVar5 + lVar11 + -0x20) = uVar6;
        puVar2 = (undefined8 *)((long)&(pPVar5->parameters).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)pPVar5 + lVar11 + -0x18);
        uVar10 = puVar2[1];
        puVar1 = (undefined8 *)((long)&(pPVar5->parameters).d.d + lVar11);
        *puVar1 = *puVar2;
        puVar1[1] = uVar10;
        puVar2 = (undefined8 *)((long)pPVar5 + lVar11 + -0x18);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pPVar5->parameters).d.size + lVar11);
        *(undefined8 *)((long)&(pPVar5->parameters).d.size + lVar11) =
             *(undefined8 *)((long)pPVar5 + lVar11 + -8);
        *(undefined8 *)((long)pPVar5 + lVar11 + -8) = uVar6;
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x30;
      } while (lVar12 != this->move);
    }
    pPVar5 = this->where;
    pDVar7 = (pPVar5->name).d.d;
    (pPVar5->name).d.d = (t->name).d.d;
    (t->name).d.d = pDVar7;
    pcVar8 = (pPVar5->name).d.ptr;
    (pPVar5->name).d.ptr = (t->name).d.ptr;
    (t->name).d.ptr = pcVar8;
    qVar4 = (pPVar5->name).d.size;
    (pPVar5->name).d.size = (t->name).d.size;
    (t->name).d.size = qVar4;
    pDVar7 = (pPVar5->parameters).d.d;
    (pPVar5->parameters).d.d = (t->parameters).d.d;
    (t->parameters).d.d = pDVar7;
    pcVar8 = (pPVar5->parameters).d.ptr;
    (pPVar5->parameters).d.ptr = (t->parameters).d.ptr;
    (t->parameters).d.ptr = pcVar8;
    qVar4 = (pPVar5->parameters).d.size;
    (pPVar5->parameters).d.size = (t->parameters).d.size;
    (t->parameters).d.size = qVar4;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar11;
  this->move = 0;
  this->sourceCopyAssign = lVar11;
  pDVar7 = (t->name).d.d;
  (t->name).d.d = (Data *)0x0;
  (pPVar5->name).d.d = pDVar7;
  pcVar8 = (t->name).d.ptr;
  (t->name).d.ptr = (char16_t *)0x0;
  (pPVar5->name).d.ptr = pcVar8;
  qVar4 = (t->name).d.size;
  (t->name).d.size = 0;
  (pPVar5->name).d.size = qVar4;
  pDVar7 = (t->parameters).d.d;
  (t->parameters).d.d = (Data *)0x0;
  (pPVar5->parameters).d.d = pDVar7;
  pcVar8 = (t->parameters).d.ptr;
  (t->parameters).d.ptr = (char16_t *)0x0;
  (pPVar5->parameters).d.ptr = pcVar8;
  qVar4 = (t->parameters).d.size;
  (t->parameters).d.size = 0;
  (pPVar5->parameters).d.size = qVar4;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }